

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void walIndexWriteHdr(Wal *pWal)

{
  WalIndexHdr *pWVar1;
  u32 *puVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  u32 uVar6;
  u32 uVar7;
  u32 uVar8;
  ulong uVar9;
  u32 uVar10;
  
  puVar2 = *pWal->apWiData;
  pWVar1 = &pWal->hdr;
  (pWal->hdr).isInit = '\x01';
  (pWal->hdr).iVersion = 0x2de218;
  uVar8 = 0;
  uVar9 = 0x40;
  uVar10 = 0;
  do {
    uVar10 = uVar10 + uVar8 + *(int *)((long)(pWal->hdr).aFrameCksum + (uVar9 - 0x58));
    uVar8 = uVar8 + *(int *)((long)(pWal->hdr).aFrameCksum + (uVar9 - 0x54)) + uVar10;
    uVar9 = uVar9 + 8;
  } while (uVar9 < 0x68);
  (pWal->hdr).aCksum[0] = uVar10;
  (pWal->hdr).aCksum[1] = uVar8;
  uVar6 = pWVar1->iVersion;
  uVar7 = pWVar1->unused;
  uVar3 = *(undefined8 *)&(pWal->hdr).iChange;
  uVar8 = (pWal->hdr).mxFrame;
  uVar10 = (pWal->hdr).nPage;
  uVar4 = *(undefined8 *)(pWal->hdr).aFrameCksum;
  uVar5 = *(undefined8 *)(pWal->hdr).aCksum;
  *(undefined8 *)(puVar2 + 0x14) = *(undefined8 *)(pWal->hdr).aSalt;
  *(undefined8 *)(puVar2 + 0x16) = uVar5;
  puVar2[0x10] = uVar8;
  puVar2[0x11] = uVar10;
  *(undefined8 *)(puVar2 + 0x12) = uVar4;
  puVar2[0xc] = uVar6;
  puVar2[0xd] = uVar7;
  *(undefined8 *)(puVar2 + 0xe) = uVar3;
  if (pWal->exclusiveMode != '\x02') {
    (*pWal->pDbFd->pMethods->xShmBarrier)(pWal->pDbFd);
  }
  uVar6 = pWVar1->iVersion;
  uVar7 = pWVar1->unused;
  uVar3 = *(undefined8 *)&(pWal->hdr).iChange;
  uVar8 = (pWal->hdr).mxFrame;
  uVar10 = (pWal->hdr).nPage;
  uVar4 = *(undefined8 *)(pWal->hdr).aFrameCksum;
  uVar5 = *(undefined8 *)(pWal->hdr).aCksum;
  *(undefined8 *)(puVar2 + 8) = *(undefined8 *)(pWal->hdr).aSalt;
  *(undefined8 *)(puVar2 + 10) = uVar5;
  puVar2[4] = uVar8;
  puVar2[5] = uVar10;
  *(undefined8 *)(puVar2 + 6) = uVar4;
  puVar2[0] = uVar6;
  puVar2[1] = uVar7;
  *(undefined8 *)(puVar2 + 2) = uVar3;
  return;
}

Assistant:

static SQLITE_NO_TSAN void walIndexWriteHdr(Wal *pWal){
  volatile WalIndexHdr *aHdr = walIndexHdr(pWal);
  const int nCksum = offsetof(WalIndexHdr, aCksum);

  assert( pWal->writeLock );
  pWal->hdr.isInit = 1;
  pWal->hdr.iVersion = WALINDEX_MAX_VERSION;
  walChecksumBytes(1, (u8*)&pWal->hdr, nCksum, 0, pWal->hdr.aCksum);
  /* Possible TSAN false-positive.  See tag-20200519-1 */
  memcpy((void*)&aHdr[1], (const void*)&pWal->hdr, sizeof(WalIndexHdr));
  walShmBarrier(pWal);
  memcpy((void*)&aHdr[0], (const void*)&pWal->hdr, sizeof(WalIndexHdr));
}